

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

_Bool rtr_mgr_conf_in_sync(rtr_mgr_config *config)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bool bVar3;
  uint local_3c;
  uint j;
  rtr_mgr_group_node *group_node;
  tommy_node_struct *ptStack_28;
  _Bool all_sync;
  tommy_node *node;
  rtr_mgr_config *config_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&config->mutex);
  ptStack_28 = tommy_list_head(&config->groups->list);
  do {
    if (ptStack_28 == (tommy_node *)0x0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
      config_local._7_1_ = false;
LAB_00106ea4:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return config_local._7_1_;
      }
      __stack_chk_fail();
    }
    bVar2 = true;
    local_3c = 0;
    while( true ) {
      bVar3 = false;
      if (bVar2) {
        bVar3 = local_3c < *(uint *)(*(long *)((long)ptStack_28->data + 0x20) + 8);
      }
      if (!bVar3) break;
      if (*(long *)(*(long *)(**(long **)((long)ptStack_28->data + 0x20) + (ulong)local_3c * 8) +
                   0x10) == 0) {
        bVar2 = false;
      }
      local_3c = local_3c + 1;
    }
    if (bVar2) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
      config_local._7_1_ = true;
      goto LAB_00106ea4;
    }
    ptStack_28 = ptStack_28->next;
  } while( true );
}

Assistant:

RTRLIB_EXPORT bool rtr_mgr_conf_in_sync(struct rtr_mgr_config *config)
{
	pthread_rwlock_rdlock(&config->mutex);
	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		bool all_sync = true;
		struct rtr_mgr_group_node *group_node = node->data;

		for (unsigned int j = 0; all_sync && (j < group_node->group->sockets_len); j++) {
			if (group_node->group->sockets[j]->last_update == 0)
				all_sync = false;
		}
		if (all_sync) {
			pthread_rwlock_unlock(&config->mutex);
			return true;
		}
		node = node->next;
	}
	pthread_rwlock_unlock(&config->mutex);
	return false;
}